

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O3

void CB_ADF::save_load(cb_adf *c,io_buf *model_file,bool read,bool text)

{
  bool bVar1;
  ostream *poVar2;
  uint64_t *puVar3;
  stringstream msg;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  bVar1 = version_struct::operator<(&c->all->model_file_ver,"8.3.2");
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"event_sum ",10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    puVar3 = &(c->gen_cs).event_sum;
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)puVar3,8,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)puVar3,8,(stringstream *)local_1b0,text);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"action_sum ",0xb);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    puVar3 = &(c->gen_cs).action_sum;
    if (read) {
      io_buf::bin_read_fixed(model_file,(char *)puVar3,8,"");
    }
    else {
      bin_text_write_fixed(model_file,(char *)puVar3,8,(stringstream *)local_1b0,text);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  }
  return;
}

Assistant:

void save_load(cb_adf& c, io_buf& model_file, bool read, bool text)
{
  if (c.all->model_file_ver < VERSION_FILE_WITH_CB_ADF_SAVE)
    return;
  stringstream msg;
  msg << "event_sum " << c.gen_cs.event_sum << "\n";
  bin_text_read_write_fixed(model_file, (char*)&c.gen_cs.event_sum, sizeof(c.gen_cs.event_sum), "", read, msg, text);

  msg << "action_sum " << c.gen_cs.action_sum << "\n";
  bin_text_read_write_fixed(model_file, (char*)&c.gen_cs.action_sum, sizeof(c.gen_cs.action_sum), "", read, msg, text);
}